

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.h
# Opt level: O0

void __thiscall
SchemeCompoundProcedure::SchemeCompoundProcedure(SchemeCompoundProcedure *this,string *name_)

{
  string *name__local;
  SchemeCompoundProcedure *this_local;
  
  SchemeProcedure::SchemeProcedure(&this->super_SchemeProcedure);
  (this->super_SchemeProcedure).super_SchemeObject._vptr_SchemeObject =
       (_func_int **)&PTR__SchemeCompoundProcedure_00245738;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->params);
  std::__cxx11::list<ASTNode,_std::allocator<ASTNode>_>::list(&this->body);
  Context::Context(&this->context);
  std::__cxx11::string::operator=((string *)&(this->super_SchemeProcedure).name,(string *)name_);
  return;
}

Assistant:

explicit SchemeCompoundProcedure(const std::string &name_ = "")
    {
        name = name_;
    }